

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  Engine *this_00;
  allocator local_59;
  string local_58;
  string local_38;
  
  ensureVolumeInspectValid(this);
  std::__cxx11::string::string((string *)&local_38,"",&local_59);
  setVolumeMeshToInspect(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  this_00 = render::engine;
  std::__cxx11::string::string((string *)&local_58,(string *)&this->postfix);
  render::Engine::removeSlicePlane(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->planeProgram).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::~array(&this->sliceBufferArr);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::~array
            (&this->sliceBufferDataArr);
  TransformationGizmo::~TransformationGizmo(&this->transformGizmo);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->volumeInspectProgram).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->inspectedMeshName);
  std::__cxx11::string::~string((string *)&this->transparency);
  std::__cxx11::string::~string((string *)&this->gridLineColor);
  std::__cxx11::string::~string((string *)&this->color);
  std::__cxx11::string::~string((string *)&this->objectTransform);
  std::__cxx11::string::~string((string *)&this->drawWidget);
  std::__cxx11::string::~string((string *)&this->drawPlane);
  std::__cxx11::string::~string((string *)&this->active);
  std::__cxx11::string::~string((string *)&this->postfix);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  ensureVolumeInspectValid();
  setVolumeMeshToInspect(""); // disable any slicing
  render::engine->removeSlicePlane(postfix);
}